

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O0

bool __thiscall
MapLoader::checkSection
          (MapLoader *this,string *mode,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *lineWords)

{
  reference pvVar1;
  char *pcVar2;
  long lVar3;
  ulong local_30;
  unsigned_long i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lineWords_local;
  string *mode_local;
  MapLoader *this_local;
  
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](lineWords,0);
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)pvVar1);
  if (*pcVar2 == '[') {
    std::__cxx11::string::operator=((string *)mode,"");
    local_30 = 1;
    while( true ) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](lineWords,0);
      lVar3 = std::__cxx11::string::size();
      if (lVar3 - 1U <= local_30) break;
      pvVar1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](lineWords,0);
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)pvVar1);
      std::__cxx11::string::operator+=((string *)mode,*pcVar2);
      local_30 = local_30 + 1;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MapLoader::checkSection(std::string* mode, std::vector<std::string>* lineWords) {
    //separate in sections
    if ((*lineWords)[0][0] == *"[") {
        *mode = "";
        for (unsigned long i = 1; i < (*lineWords)[0].size() - 1; i++) {
            *mode += (*lineWords)[0][i];
        }
        return true;
    }
    return false;
}